

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

stb_vorbis *
stb_vorbis_open_file_section
          (FAudioIOStream *file,int close_on_free,int *error,stb_vorbis_alloc *alloc,uint length)

{
  int iVar1;
  int64_t iVar2;
  stb_vorbis *f;
  stb_vorbis p;
  
  vorbis_init(&p,alloc);
  p.f = file;
  iVar2 = (*file->seek)(file->data,0,1);
  p.f_start = (uint32)iVar2;
  p.close_on_free = close_on_free;
  p.stream_len = length;
  iVar1 = start_decoder(&p);
  if ((iVar1 != 0) && (f = vorbis_alloc(&p), f != (stb_vorbis *)0x0)) {
    memcpy(f,&p,0x720);
    vorbis_pump_first_frame(f);
    return f;
  }
  if (error != (int *)0x0) {
    *error = p.error;
  }
  vorbis_deinit(&p);
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis * stb_vorbis_open_file_section(FILE *file, int close_on_free, int *error, const stb_vorbis_alloc *alloc, unsigned int length)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.f = file;
   p.f_start = (uint32) ftell(file);
   p.stream_len   = length;
   p.close_on_free = close_on_free;
   if (start_decoder(&p)) {
      f = vorbis_alloc(&p);
      if (f) {
         *f = p;
         vorbis_pump_first_frame(f);
         return f;
      }
   }
   if (error) *error = p.error;
   vorbis_deinit(&p);
   return NULL;
}